

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_hash.c
# Opt level: O1

void lyd_unlink_hash(lyd_node *node)

{
  long lVar1;
  byte *pbVar2;
  char *pcVar3;
  LY_ERR LVar4;
  uint32_t uVar5;
  size_t sVar6;
  uint32_t *in_RDI;
  undefined8 uVar7;
  uint32_t *local_20;
  
  lVar1 = *(long *)(in_RDI + 4);
  if (lVar1 == 0) {
    return;
  }
  if (*(long *)(in_RDI + 2) == 0) {
    return;
  }
  if (*(long *)(lVar1 + 8) == 0) {
    return;
  }
  if (*(ly_ht **)(lVar1 + 0x40) != (ly_ht *)0x0) {
    local_20 = in_RDI;
    LVar4 = lyht_remove(*(ly_ht **)(lVar1 + 0x40),&local_20,*in_RDI);
    pbVar2 = *(byte **)(local_20 + 2);
    if (LVar4 == LY_SUCCESS) {
      if ((*pbVar2 & 0x18) == 0) {
        return;
      }
      if ((*(long *)(*(long *)(local_20 + 8) + 0x18) != 0) &&
         (*(byte **)(*(long *)(local_20 + 8) + 8) == pbVar2)) {
        return;
      }
      pcVar3 = *(char **)(*(long *)(pbVar2 + 8) + 8);
      sVar6 = strlen(pcVar3);
      uVar5 = lyht_hash_multi(0,pcVar3,sVar6);
      pcVar3 = *(char **)(*(long *)(local_20 + 2) + 0x28);
      sVar6 = strlen(pcVar3);
      uVar5 = lyht_hash_multi(uVar5,pcVar3,sVar6);
      uVar5 = lyht_hash_multi(uVar5,(char *)0x0,0);
      LVar4 = lyht_remove(*(ly_ht **)(*(long *)(local_20 + 4) + 0x40),&local_20,uVar5);
      if (LVar4 == LY_SUCCESS) {
        if (*(long *)(local_20 + 6) == 0) {
          return;
        }
        if (*(long *)(*(long *)(local_20 + 6) + 8) != *(long *)(local_20 + 2)) {
          return;
        }
        LVar4 = lyht_insert(*(ly_ht **)(*(long *)(local_20 + 4) + 0x40),local_20 + 6,uVar5,
                            (void **)0x0);
        if (LVar4 == LY_SUCCESS) {
          return;
        }
        if (*(long *)(local_20 + 2) == 0) {
          local_20 = local_20 + 0x1e;
        }
        else {
          local_20 = *(uint32_t **)(*(long *)(local_20 + 2) + 8);
        }
        uVar7 = 0xe7;
      }
      else {
        if (*(long *)(local_20 + 2) == 0) {
          local_20 = local_20 + 0x1e;
        }
        else {
          local_20 = *(uint32_t **)(*(long *)(local_20 + 2) + 8);
        }
        uVar7 = 0xe0;
      }
    }
    else {
      if (pbVar2 == (byte *)0x0) {
        local_20 = local_20 + 0x1e;
      }
      else {
        local_20 = *(uint32_t **)(pbVar2 + 8);
      }
      uVar7 = 0xd3;
    }
    ly_log(*(ly_ctx **)local_20,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_hash.c"
           ,uVar7);
    return;
  }
  return;
}

Assistant:

void
lyd_unlink_hash(struct lyd_node *node)
{
    uint32_t hash;

    if (!node->parent || !node->schema || !node->parent->schema || !node->parent->children_ht) {
        /* not in any HT */
        return;
    }

    /* remove from the parent HT */
    if (lyht_remove(node->parent->children_ht, &node, node->hash)) {
        LOGINT(LYD_CTX(node));
        return;
    }

    /* first instance of the (leaf-)list, needs to be removed from HT */
    if ((node->schema->nodetype & (LYS_LIST | LYS_LEAFLIST)) && (!node->prev->next || (node->prev->schema != node->schema))) {
        /* get the simple hash */
        hash = lyht_hash_multi(0, node->schema->module->name, strlen(node->schema->module->name));
        hash = lyht_hash_multi(hash, node->schema->name, strlen(node->schema->name));
        hash = lyht_hash_multi(hash, NULL, 0);

        /* remove the instance */
        if (lyht_remove(node->parent->children_ht, &node, hash)) {
            LOGINT(LYD_CTX(node));
            return;
        }

        /* add the next instance */
        if (node->next && (node->next->schema == node->schema)) {
            if (lyht_insert(node->parent->children_ht, &node->next, hash, NULL)) {
                LOGINT(LYD_CTX(node));
                return;
            }
        }
    }
}